

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testColorProperty_Test::MaterialSystemTest_testColorProperty_Test
          (MaterialSystemTest_testColorProperty_Test *this)

{
  MaterialSystemTest_testColorProperty_Test *this_local;
  
  MaterialSystemTest::MaterialSystemTest(&this->super_MaterialSystemTest);
  (this->super_MaterialSystemTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MaterialSystemTest_testColorProperty_Test_0103ded0;
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testColorProperty)
{
    aiColor4D clr;
    clr.r = 2.0f;clr.g = 3.0f;clr.b = 4.0f;clr.a = 5.0f;
    this->pcMat->AddProperty(&clr,1,"testKey5");
    clr.b = 1.0f;
    clr.a = clr.g = clr.r = 0.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey5",0,0,clr));
    EXPECT_TRUE(clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f);
}